

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O1

yin_t * yin_init(int frame_size,float search_threshold,float search_range,int smooth_window)

{
  yin_t *pyVar1;
  fixed32 **ppfVar2;
  uint16 *puVar3;
  byte bVar4;
  
  pyVar1 = (yin_t *)__ckd_calloc__(1,0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/yin.c"
                                   ,0x88);
  pyVar1->frame_size = (uint16)frame_size;
  pyVar1->search_threshold = (uint16)(int)(search_threshold * 32768.0);
  pyVar1->search_range = (uint16)(int)(search_range * 32768.0);
  bVar4 = (char)smooth_window * '\x02' + 1;
  pyVar1->wsize = bVar4;
  ppfVar2 = (fixed32 **)
            __ckd_calloc_2d__((ulong)bVar4,(ulong)((frame_size & 0xffffU) >> 1),4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/yin.c"
                              ,0x8f);
  pyVar1->diff_window = ppfVar2;
  puVar3 = (uint16 *)
           __ckd_calloc__((ulong)pyVar1->wsize,2,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/yin.c"
                          ,0x91);
  pyVar1->period_window = puVar3;
  return pyVar1;
}

Assistant:

yin_t *
yin_init(int frame_size, float search_threshold,
         float search_range, int smooth_window)
{
    yin_t *pe;

    pe = ckd_calloc(1, sizeof(*pe));
    pe->frame_size = frame_size;
    pe->search_threshold = (uint16)(search_threshold * 32768);
    pe->search_range = (uint16)(search_range * 32768);
    pe->wsize = smooth_window * 2 + 1;
    pe->diff_window = ckd_calloc_2d(pe->wsize,
                                    pe->frame_size / 2,
                                    sizeof(**pe->diff_window));
    pe->period_window = ckd_calloc(pe->wsize,
                                   sizeof(*pe->period_window));
    return pe;
}